

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedResourceSignatureImpl.cpp
# Opt level: O0

PipelineResourceSignatureDesc * __thiscall
Diligent::SerializedResourceSignatureImpl::GetDesc(SerializedResourceSignatureImpl *this)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  SerializedResourceSignatureImpl *this_local;
  
  if (this->m_pDesc == (PipelineResourceSignatureDesc *)0x0) {
    msg.field_2._8_8_ = this;
    FormatString<char[34]>((string *)local_38,(char (*) [34])"No device signatures initialized!");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedResourceSignatureImpl.cpp"
               ,0x82);
    std::__cxx11::string::~string((string *)local_38);
    this_local = (SerializedResourceSignatureImpl *)&GetDesc::NullDesc;
  }
  else {
    this_local = (SerializedResourceSignatureImpl *)this->m_pDesc;
  }
  return (PipelineResourceSignatureDesc *)this_local;
}

Assistant:

const PipelineResourceSignatureDesc& SerializedResourceSignatureImpl::GetDesc() const
{
    if (m_pDesc != nullptr)
        return *m_pDesc;

    UNEXPECTED("No device signatures initialized!");
    static constexpr PipelineResourceSignatureDesc NullDesc;
    return NullDesc;
}